

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unz64local_getLong(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,uLong *pX)

{
  uint in_EAX;
  int iVar1;
  uLong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int i;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
  uVar4 = (ulong)uStack_38._4_4_;
  if (iVar1 == 0) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
  }
  lVar5 = (long)uStack_38._4_4_;
  if (iVar1 == 0) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
  }
  lVar3 = (long)uStack_38._4_4_;
  if (iVar1 == 0) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_38 + 4));
  }
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (long)uStack_38._4_4_ * 0x1000000 + (lVar3 << 0x10 | lVar5 << 8 | uVar4);
  }
  *pX = uVar2;
  return iVar1;
}

Assistant:

local int unz64local_getLong(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    uLong* pX)
{
    uLong x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (uLong)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 8;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 16;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x += ((uLong)i) << 24;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}